

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

NormalizerSpec * sentencepiece::SentencePieceTrainer::GetNormalizerSpec(string_view name)

{
  bool bVar1;
  NormalizerSpec *this;
  string *this_00;
  Status *this_01;
  ostream *poVar2;
  NormalizerSpec *in_RDI;
  Status _status;
  NormalizerSpec *spec;
  string *in_stack_000002e8;
  string_view in_stack_000002f0;
  char *in_stack_ffffffffffffff08;
  ostream *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  NormalizerSpec *value;
  string local_70 [38];
  byte local_4a;
  Die local_49;
  undefined1 local_48 [16];
  undefined1 local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_19 = 0;
  value = in_RDI;
  NormalizerSpec::NormalizerSpec((NormalizerSpec *)0x4d03a9);
  this_02 = &local_18;
  this = (NormalizerSpec *)std::basic_string_view<char,_std::char_traits<char>_>::data(this_02);
  std::basic_string_view<char,_std::char_traits<char>_>::size(this_02);
  NormalizerSpec::set_name(this,(char *)value,(size_t)this_02);
  this_00 = NormalizerSpec::name_abi_cxx11_((NormalizerSpec *)0x4d03ea);
  local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  NormalizerSpec::mutable_precompiled_charsmap_abi_cxx11_((NormalizerSpec *)0x4d0415);
  normalizer::Builder::GetPrecompiledCharsMap(in_stack_000002f0,in_stack_000002e8);
  local_4a = 0;
  bVar1 = util::Status::ok((Status *)0x4d045d);
  if (!bVar1) {
    error::Die::Die(&local_49,true);
    local_4a = 1;
    this_01 = (Status *)logging::BaseName(in_stack_ffffffffffffff08);
    poVar2 = std::operator<<((ostream *)&std::cerr,(char *)this_01);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x60);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"_status.ok()");
    poVar2 = std::operator<<(poVar2,"] ");
    util::Status::ToString_abi_cxx11_(this_01);
    in_stack_ffffffffffffff10 = std::operator<<(poVar2,local_70);
    error::Die::operator&(&local_49,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_70);
  }
  if ((local_4a & 1) != 0) {
    error::Die::~Die((Die *)in_stack_ffffffffffffff10);
  }
  util::Status::~Status((Status *)0x4d05bc);
  return in_RDI;
}

Assistant:

NormalizerSpec SentencePieceTrainer::GetNormalizerSpec(absl::string_view name) {
  NormalizerSpec spec;
  spec.set_name(name.data(), name.size());
  CHECK_OK(normalizer::Builder::GetPrecompiledCharsMap(
      spec.name(), spec.mutable_precompiled_charsmap()));
  return spec;
}